

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O3

void cjson_minify_should_remove_multiline_comments(void)

{
  char *json;
  
  json = (char *)malloc(0x33);
  if (json == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x4d);
    DAT_00000020 = '\n';
    DAT_00000020_1._0_1_ = ' ';
    DAT_00000020_1._1_1_ = '{';
    DAT_00000020_1._2_1_ = 'c';
    DAT_00000020_1._3_1_ = 'o';
    DAT_00000020_1._4_1_ = 'm';
    DAT_00000020_1._5_1_ = 'm';
    DAT_00000020_1._6_1_ = 'e';
    uRam0000000000000028 = 0x20225c2220746e;
    DAT_00000010 = '*';
    DAT_00000010_1._0_1_ = ' ';
    DAT_00000010_1._1_1_ = 'm';
    DAT_00000010_1._2_1_ = 'u';
    DAT_00000010_1._3_1_ = 'l';
    DAT_00000010_1._4_1_ = 't';
    DAT_00000010_1._5_1_ = 'i';
    DAT_00000010_1._6_1_ = '\n';
    uRam0000000000000018._0_1_ = ' ';
    uRam0000000000000018._1_1_ = '/';
    uRam0000000000000018._2_1_ = '/';
    uRam0000000000000018._3_1_ = 'l';
    uRam0000000000000018._4_1_ = 'i';
    uRam0000000000000018._5_1_ = 'n';
    uRam0000000000000018._6_1_ = 'e';
    uRam0000000000000018._7_1_ = ' ';
    DAT_00000000 = '{';
    DAT_00000000_1._0_1_ = '/';
    DAT_00000000_1._1_1_ = '*';
    DAT_00000000_1._2_1_ = ' ';
    DAT_00000000_1._3_1_ = 't';
    DAT_00000000_1._4_1_ = 'h';
    DAT_00000000_1._5_1_ = 'i';
    DAT_00000000_1._6_1_ = 's';
    uRam0000000000000008._0_1_ = ' ';
    uRam0000000000000008._1_1_ = 'i';
    uRam0000000000000008._2_1_ = 's';
    uRam0000000000000008._3_1_ = '\n';
    uRam0000000000000008._4_1_ = ' ';
    DAT_0000000d = 'a';
    uRam0000000000000008._6_1_ = ' ';
    uRam0000000000000008._7_1_ = '/';
    _DAT_0000002f = 0x7d2f2a;
  }
  else {
    builtin_strncpy(json,"{/* this is\n a /* multi\n //line \n {comment \"\\\" */}",0x33);
    cJSON_Minify(json);
  }
  UnityAssertEqualString("{}",json,(char *)0x0,0x51);
  free(json);
  return;
}

Assistant:

static void cjson_minify_should_remove_multiline_comments(void)
{
    const char to_minify[] = "{/* this is\n a /* multi\n //line \n {comment \"\\\" */}";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{}", minified);

    free(minified);
}